

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_readlink(uv_fs_t *req)

{
  size_t __len;
  char *__buf;
  int *piVar1;
  ssize_t sVar2;
  char *buf;
  ssize_t len;
  uv_fs_t *req_local;
  
  __len = uv__fs_pathmax_size(req->path);
  __buf = (char *)uv__malloc(__len + 1);
  if (__buf == (char *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xc;
    req_local = (uv_fs_t *)0xffffffffffffffff;
  }
  else {
    sVar2 = readlink(req->path,__buf,__len);
    if (sVar2 == -1) {
      uv__free(__buf);
      req_local = (uv_fs_t *)0xffffffffffffffff;
    }
    else {
      __buf[sVar2] = '\0';
      req->ptr = __buf;
      req_local = (uv_fs_t *)0x0;
    }
  }
  return (ssize_t)req_local;
}

Assistant:

static ssize_t uv__fs_readlink(uv_fs_t* req) {
  ssize_t len;
  char* buf;

  len = uv__fs_pathmax_size(req->path);
  buf = uv__malloc(len + 1);

  if (buf == NULL) {
    errno = ENOMEM;
    return -1;
  }

  len = readlink(req->path, buf, len);

  if (len == -1) {
    uv__free(buf);
    return -1;
  }

  buf[len] = '\0';
  req->ptr = buf;

  return 0;
}